

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

void __thiscall glu::sl::ShaderParser::~ShaderParser(ShaderParser *this)

{
  std::__cxx11::string::~string((string *)&this->m_curTokenStr);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->m_input).super__Vector_base<char,_std::allocator<char>_>);
  de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::~UniqueBase
            (&(this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>
            );
  std::__cxx11::string::~string((string *)&this->m_filename);
  return;
}

Assistant:

ShaderParser::~ShaderParser (void)
{
}